

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cputlb.c
# Opt level: O2

void tlb_set_page_with_attrs_sparc64
               (CPUState *cpu,target_ulong vaddr,hwaddr paddr,MemTxAttrs attrs,int prot,int mmu_idx,
               target_ulong size)

{
  undefined8 *puVar1;
  long *plVar2;
  undefined8 *puVar3;
  CPUArchState_conflict19 *pCVar4;
  _func_int_CPUState_ptr_MemTxAttrs_conflict *p_Var5;
  undefined8 uVar6;
  undefined8 uVar7;
  MemoryRegion_conflict *pMVar8;
  FlatView *pFVar9;
  MemoryListener *pMVar10;
  QTailQLink *pQVar11;
  QTailQLink *pQVar12;
  _Bool _Var13;
  int asidx;
  uint uVar14;
  uint uVar15;
  target_ulong tVar16;
  MemoryRegionSection *section;
  CPUTLBEntry *pCVar17;
  void *pvVar18;
  ram_addr_t rVar19;
  hwaddr hVar20;
  ulong uVar21;
  long lVar22;
  target_ulong page;
  ulong uVar23;
  uc_struct_conflict9 *uc;
  ulong uVar24;
  long lVar25;
  CPUTLBEntry *tlb_entry;
  MemTxAttrs in_stack_ffffffffffffff68;
  int prot_local;
  ulong local_88;
  hwaddr xlat;
  MemTxAttrs local_74;
  long local_70;
  ulong *local_68;
  long local_60;
  CPUArchState_conflict19 *local_58;
  long local_50;
  target_ulong *local_48;
  FlatView *local_40;
  ulong local_38;
  
  pCVar4 = (CPUArchState_conflict19 *)cpu->env_ptr;
  p_Var5 = cpu->cc->asidx_from_attrs;
  prot_local = prot;
  if (p_Var5 == (_func_int_CPUState_ptr_MemTxAttrs_conflict *)0x0) {
    asidx = 0;
  }
  else {
    asidx = (*p_Var5)((CPUState_conflict *)cpu,in_stack_ffffffffffffff68);
    if ((asidx < 0) || (cpu->num_ases <= asidx)) {
      __assert_fail("ret < cpu->num_ases && ret >= 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/include/hw/core/cpu.h"
                    ,0x1a5,"int cpu_asidx_from_attrs(CPUState *, MemTxAttrs)");
    }
  }
  local_48 = pCVar4[-1].regbase + 0x1cd;
  local_60 = (long)mmu_idx;
  local_50 = local_60 * 0x2b8;
  local_68 = (ulong *)((long)pCVar4 + local_50 + -0x10c0);
  local_38 = 0x2000;
  if (0x2000 < size) {
    uVar24 = *local_68;
    uVar21 = -size;
    tVar16 = vaddr;
    if (uVar24 != 0xffffffffffffffff) {
      uVar23 = uVar21 & *(ulong *)((long)pCVar4 + local_50 + -0x10b8);
      do {
        uVar21 = uVar23;
        tVar16 = uVar24;
        uVar23 = uVar21 * 2;
      } while ((uVar21 & (uVar24 ^ vaddr)) != 0);
    }
    *local_68 = tVar16 & uVar21;
    *(ulong *)((long)pCVar4 + local_50 + -0x10b8) = uVar21;
    local_38 = size;
  }
  local_40 = (FlatView *)(paddr & 0xffffffffffffe000);
  local_58 = pCVar4;
  section = address_space_translate_for_iotlb_sparc64
                      (cpu,asidx,(hwaddr)local_40,&xlat,&local_38,attrs,&prot_local);
  if (0x1fff < local_38) {
    tlb_entry = (CPUTLBEntry *)(vaddr & 0xffffffffffffe000);
    pCVar17 = (CPUTLBEntry *)((ulong)tlb_entry | 0x1000);
    if (0x1fff < size) {
      pCVar17 = tlb_entry;
    }
    uVar24 = (ulong)((uint)attrs >> 0xb & 0x100) | (ulong)pCVar17;
    local_74 = attrs;
    if (section->mr->ram == true) {
      pvVar18 = memory_region_get_ram_ptr_sparc64(section->mr);
      local_70 = (long)pvVar18 + xlat;
      rVar19 = memory_region_get_ram_addr_sparc64(section->mr);
      lVar25 = rVar19 + xlat;
      local_88 = uVar24;
      if ((prot_local & 2U) != 0) {
        if (section->readonly == true) {
          local_88 = uVar24 | 0x80;
        }
        else {
          local_88 = uVar24 | 0x800;
        }
      }
    }
    else {
      hVar20 = memory_region_section_get_iotlb_sparc64(cpu,section);
      lVar25 = hVar20 + xlat;
      uVar24 = uVar24 | 0x400;
      local_70 = 0;
      local_88 = uVar24;
    }
    uVar14 = cpu_watchpoint_address_matches_sparc64(cpu,(vaddr)tlb_entry,0x2000);
    uVar21 = vaddr >> 0xd & local_58->gregs[local_60 * 2 + -0xe] >> 6;
    uc = (uc_struct_conflict9 *)(uVar21 * 0x40 + local_58->gregs[local_60 * 2 + -0xd]);
    *(ushort *)(local_58[-1].regbase + 0x1c9) =
         (ushort)local_58[-1].regbase[0x1c9] | (ushort)(1 << ((byte)local_60 & 0x1f));
    tlb_flush_vtlb_page_locked(local_58,(int)local_60,(target_ulong)tlb_entry);
    _Var13 = tlb_hit_page_anyprot(uc,tlb_entry,page);
    if ((!_Var13) &&
       (((lVar22._0_4_ = uc->arch, lVar22._4_4_ = uc->mode, lVar22 != -1 ||
         (*(long *)&uc->errnum != -1)) ||
        ((uc->address_space_memory).root != (MemoryRegion_conflict *)0xffffffffffffffff)))) {
      uVar23 = local_68[5];
      local_68[5] = uVar23 + 1;
      uVar15 = (uint)uVar23 & 7;
      uVar23 = (ulong)(uVar15 << 6);
      uVar6 = *(undefined8 *)uc;
      uVar7 = *(undefined8 *)&uc->errnum;
      pMVar8 = (uc->address_space_memory).root;
      pFVar9 = (uc->address_space_memory).current_map;
      pMVar10 = (uc->address_space_memory).listeners.tqh_first;
      pQVar11 = (uc->address_space_memory).listeners.tqh_circ.tql_prev;
      pQVar12 = (uc->address_space_memory).address_spaces_link.tqe_circ.tql_prev;
      puVar1 = (undefined8 *)((long)local_68 + uVar23 + 0x60);
      *puVar1 = (uc->address_space_memory).address_spaces_link.tqe_next;
      puVar1[1] = pQVar12;
      puVar1 = (undefined8 *)((long)local_68 + uVar23 + 0x50);
      *puVar1 = pMVar10;
      puVar1[1] = pQVar11;
      puVar1 = (undefined8 *)((long)local_68 + uVar23 + 0x40);
      *puVar1 = pMVar8;
      puVar1[1] = pFVar9;
      puVar1 = (undefined8 *)((long)local_68 + uVar23 + 0x30);
      *puVar1 = uVar6;
      puVar1[1] = uVar7;
      puVar1 = (undefined8 *)(local_68[0x56] + (uVar21 & 0xffffffff) * 0x10);
      uVar6 = puVar1[1];
      puVar3 = (undefined8 *)((long)local_68 + (ulong)(uVar15 << 4) + 0x230);
      *puVar3 = *puVar1;
      puVar3[1] = uVar6;
      plVar2 = (long *)((long)local_48 + local_50 + 0x20);
      *plVar2 = *plVar2 + -1;
    }
    uVar23 = local_68[0x56];
    lVar22 = (uVar21 & 0xffffffff) * 0x10;
    *(long *)(uVar23 + lVar22) = lVar25 - (long)tlb_entry;
    *(MemTxAttrs *)(uVar23 + 8 + lVar22) = local_74;
    if ((prot_local & 2U) == 0) {
      uVar21 = 0xffffffffffffffff;
    }
    else {
      uVar21 = local_88 | (uVar14 & 2) << 8 | (ulong)((prot_local & 0x40U) << 6);
    }
    uVar23 = -(ulong)((prot_local & 1U) == 0) | (uVar14 & 1) << 9 | uVar24;
    uc->arch = (int)uVar23;
    uc->mode = (int)(uVar23 >> 0x20);
    *(ulong *)&uc->errnum = uVar21;
    (uc->address_space_memory).root =
         (MemoryRegion_conflict *)(-(ulong)((prot_local & 4U) == 0) | uVar24);
    (uc->address_space_memory).current_map = local_40;
    (uc->address_space_memory).listeners.tqh_first = (MemoryListener *)(local_70 - (long)tlb_entry);
    plVar2 = (long *)((long)local_48 + local_50 + 0x20);
    *plVar2 = *plVar2 + 1;
    return;
  }
  __assert_fail("sz >= TARGET_PAGE_SIZE",
                "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/accel/tcg/cputlb.c"
                ,0x322,
                "void tlb_set_page_with_attrs_sparc64(CPUState *, target_ulong, hwaddr, MemTxAttrs, int, int, target_ulong)"
               );
}

Assistant:

void tlb_set_page_with_attrs(CPUState *cpu, target_ulong vaddr,
                             hwaddr paddr, MemTxAttrs attrs, int prot,
                             int mmu_idx, target_ulong size)
{
#ifdef TARGET_ARM
    struct uc_struct *uc = cpu->uc;
#endif
    CPUArchState *env = cpu->env_ptr;
    CPUTLB *tlb = env_tlb(env);
    CPUTLBDesc *desc = &tlb->d[mmu_idx];
    MemoryRegionSection *section;
    unsigned int index;
    target_ulong address;
    target_ulong write_address;
    uintptr_t addend;
    CPUTLBEntry *te, tn;
    hwaddr iotlb, xlat, sz, paddr_page;
    target_ulong vaddr_page;
    int asidx = cpu_asidx_from_attrs(cpu, attrs);
    int wp_flags;
    bool is_ram;

    // assert_cpu_is_self(cpu);

    if (size <= TARGET_PAGE_SIZE) {
        sz = TARGET_PAGE_SIZE;
    } else {
        tlb_add_large_page(env, mmu_idx, vaddr, size);
        sz = size;
    }
    vaddr_page = vaddr & TARGET_PAGE_MASK;
    paddr_page = paddr & TARGET_PAGE_MASK;

    section = address_space_translate_for_iotlb(cpu, asidx, paddr_page,
                                                &xlat, &sz, attrs, &prot);
    assert(sz >= TARGET_PAGE_SIZE);

    address = vaddr_page;
    if (size < TARGET_PAGE_SIZE) {
        /* Repeat the MMU check and TLB fill on every access.  */
        address |= TLB_INVALID_MASK;
    }
    if (attrs.byte_swap) {
        address |= TLB_BSWAP;
    }

    is_ram = memory_region_is_ram(section->mr);
    // is_romd = memory_region_is_romd(section->mr);

    if (is_ram) {
        /* RAM and ROMD both have associated host memory. */
        addend = (uintptr_t)memory_region_get_ram_ptr(section->mr) + xlat;
    } else {
        /* I/O does not; force the host address to NULL. */
        addend = 0;
    }

    write_address = address;
    if (is_ram) {
        iotlb = memory_region_get_ram_addr(section->mr) + xlat;
        /*
         * Computing is_clean is expensive; avoid all that unless
         * the page is actually writable.
         */
        if (prot & PAGE_WRITE) {
            if (section->readonly) {
                write_address |= TLB_DISCARD_WRITE;
            } else if (cpu_physical_memory_is_clean(iotlb)) {
                write_address |= TLB_NOTDIRTY;
            }
        }
    } else {
        /* I/O or ROMD */
        iotlb = memory_region_section_get_iotlb(cpu, section) + xlat;
        /*
         * Writes to romd devices must go through MMIO to enable write.
         * Reads to romd devices go through the ram_ptr found above,
         * but of course reads to I/O must go through MMIO.
         */
        write_address |= TLB_MMIO;
        //if (!is_romd) {
            address = write_address;
        //}
    }

    wp_flags = cpu_watchpoint_address_matches(cpu, vaddr_page,
                                              TARGET_PAGE_SIZE);

    index = tlb_index(env, mmu_idx, vaddr_page);
    te = tlb_entry(env, mmu_idx, vaddr_page);

    /* Note that the tlb is no longer clean.  */
    tlb->c.dirty |= 1 << mmu_idx;

    /* Make sure there's no cached translation for the new page.  */
    tlb_flush_vtlb_page_locked(env, mmu_idx, vaddr_page);

    /*
     * Only evict the old entry to the victim tlb if it's for a
     * different page; otherwise just overwrite the stale data.
     */
    if (!tlb_hit_page_anyprot(env->uc, te, vaddr_page) && !tlb_entry_is_empty(te)) {
        unsigned vidx = desc->vindex++ % CPU_VTLB_SIZE;
        CPUTLBEntry *tv = &desc->vtable[vidx];

        /* Evict the old entry into the victim tlb.  */
        copy_tlb_helper_locked(tv, te);
        desc->viotlb[vidx] = desc->iotlb[index];
        tlb_n_used_entries_dec(env, mmu_idx);
    }

    /* refill the tlb */
    /*
     * At this point iotlb contains a physical section number in the lower
     * TARGET_PAGE_BITS, and either
     *  + the ram_addr_t of the page base of the target RAM (RAM)
     *  + the offset within section->mr of the page base (I/O, ROMD)
     * We subtract the vaddr_page (which is page aligned and thus won't
     * disturb the low bits) to give an offset which can be added to the
     * (non-page-aligned) vaddr of the eventual memory access to get
     * the MemoryRegion offset for the access. Note that the vaddr we
     * subtract here is that of the page base, and not the same as the
     * vaddr we add back in io_readx()/io_writex()/get_page_addr_code().
     */
    desc->iotlb[index].addr = iotlb - vaddr_page;
    desc->iotlb[index].attrs = attrs;

    /* Now calculate the new entry */
    tn.addend = addend - vaddr_page;
    tn.paddr = paddr_page;
    if (prot & PAGE_READ) {
        tn.addr_read = address;
        if (wp_flags & BP_MEM_READ) {
            tn.addr_read |= TLB_WATCHPOINT;
        }
    } else {
        tn.addr_read = -1;
    }

    if (prot & PAGE_EXEC) {
        tn.addr_code = address;
    } else {
        tn.addr_code = -1;
    }

    tn.addr_write = -1;
    if (prot & PAGE_WRITE) {
        tn.addr_write = write_address;
        if (prot & PAGE_WRITE_INV) {
            tn.addr_write |= TLB_INVALID_MASK;
        }
        if (wp_flags & BP_MEM_WRITE) {
            tn.addr_write |= TLB_WATCHPOINT;
        }
    }

    copy_tlb_helper_locked(te, &tn);
    tlb_n_used_entries_inc(env, mmu_idx);
}